

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupDestinationRecord.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GroupDestinationRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GroupDestinationRecord *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Group Destination Record");
  poVar1 = std::operator<<(poVar1,"\nGroup Bit Field:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\nPriority:              ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DstPriority);
  poVar1 = std::operator<<(poVar1,"\nLine State Command:    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LnStCmd);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString GroupDestinationRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Group Destination Record"
       << "\nGroup Bit Field:       " << m_ui32GrpBtField
       << "\nPriority:              " << ( KUINT16 )m_ui8DstPriority
       << "\nLine State Command:    " << ( KUINT16 )m_ui8LnStCmd
       << "\n";

    return ss.str();
}